

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestCase::swap(TestCase *this,TestCase *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SpecialProperties SVar2;
  ITestCase *pIVar3;
  SourceLineInfo *this_00;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  size_t local_38;
  
  pIVar3 = (this->test).m_p;
  (this->test).m_p = (other->test).m_p;
  (other->test).m_p = pIVar3;
  std::__cxx11::string::swap((string *)this);
  std::__cxx11::string::swap((string *)&(this->super_TestCaseInfo).className);
  std::__cxx11::string::swap((string *)&(this->super_TestCaseInfo).description);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap(&(this->super_TestCaseInfo).tags._M_t,&(other->super_TestCaseInfo).tags._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap(&(this->super_TestCaseInfo).lcaseTags._M_t,&(other->super_TestCaseInfo).lcaseTags._M_t);
  std::__cxx11::string::swap((string *)&(this->super_TestCaseInfo).tagsAsString);
  SVar2 = (this->super_TestCaseInfo).properties;
  (this->super_TestCaseInfo).properties = (other->super_TestCaseInfo).properties;
  (other->super_TestCaseInfo).properties = SVar2;
  this_00 = &(other->super_TestCaseInfo).lineInfo;
  local_58 = (size_type *)(this->super_TestCaseInfo).lineInfo.file._M_dataplus._M_p;
  paVar1 = &(this->super_TestCaseInfo).lineInfo.file.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58 == paVar1) {
    local_48 = paVar1->_M_allocated_capacity;
    uStack_40 = *(undefined8 *)((long)&(this->super_TestCaseInfo).lineInfo.file.field_2 + 8);
    local_58 = &local_48;
  }
  else {
    local_48 = paVar1->_M_allocated_capacity;
  }
  local_50 = (this->super_TestCaseInfo).lineInfo.file._M_string_length;
  (this->super_TestCaseInfo).lineInfo.file._M_dataplus._M_p = (pointer)paVar1;
  (this->super_TestCaseInfo).lineInfo.file._M_string_length = 0;
  (this->super_TestCaseInfo).lineInfo.file.field_2._M_local_buf[0] = '\0';
  local_38 = (this->super_TestCaseInfo).lineInfo.line;
  std::__cxx11::string::operator=((string *)&(this->super_TestCaseInfo).lineInfo,(string *)this_00);
  (this->super_TestCaseInfo).lineInfo.line = (other->super_TestCaseInfo).lineInfo.line;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_58);
  (other->super_TestCaseInfo).lineInfo.line = local_38;
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void TestCase::swap( TestCase& other ) {
        test.swap( other.test );
        name.swap( other.name );
        className.swap( other.className );
        description.swap( other.description );
        tags.swap( other.tags );
        lcaseTags.swap( other.lcaseTags );
        tagsAsString.swap( other.tagsAsString );
        std::swap( TestCaseInfo::properties, static_cast<TestCaseInfo&>( other ).properties );
        std::swap( lineInfo, other.lineInfo );
    }